

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.cpp
# Opt level: O1

int hwnet::http::HttpSession::on_headers_complete(http_parser *parser)

{
  _Rb_tree_header *p_Var1;
  __weak_count<(__gnu_cxx::_Lock_policy)2> *packet;
  __weak_ptr<hwnet::http::HttpSession,_(__gnu_cxx::_Lock_policy)2> *__r;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  long lVar3;
  mapped_type *pmVar4;
  HttpRequest *this;
  HttpResponse *pHVar5;
  shared_ptr<hwnet::http::HttpSession> local_68;
  shared_ptr<hwnet::http::HttpPacket> local_58;
  __shared_ptr<hwnet::http::HttpRequest,(__gnu_cxx::_Lock_policy)2> local_48 [8];
  Ptr req;
  Ptr resp;
  
  __r = (__weak_ptr<hwnet::http::HttpSession,_(__gnu_cxx::_Lock_policy)2> *)parser->data;
  packet = &__r[9]._M_refcount;
  p_Var2 = __r[9]._M_refcount._M_pi;
  lVar3._0_4_ = p_Var2[8]._M_use_count;
  lVar3._4_4_ = p_Var2[8]._M_weak_count;
  if (lVar3 != 0) {
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)(p_Var2 + 5),(key_type *)(p_Var2 + 8));
    std::__cxx11::string::_M_assign((string *)pmVar4);
    p_Var2 = packet->_M_pi;
    p_Var2[8]._M_use_count = 0;
    p_Var2[8]._M_weak_count = 0;
    *(undefined1 *)p_Var2[8]._vptr__Sp_counted_base = 0;
    p_Var2 = packet->_M_pi;
    p_Var2[10]._M_use_count = 0;
    p_Var2[10]._M_weak_count = 0;
    *(undefined1 *)p_Var2[10]._vptr__Sp_counted_base = 0;
  }
  p_Var2 = __r[9]._M_refcount._M_pi;
  *(unsigned_short *)&p_Var2->_M_use_count = parser->http_major;
  *(unsigned_short *)((long)&p_Var2->_M_use_count + 2) = parser->http_minor;
  if (*(int *)&__r[9]._M_ptr == 2) {
    this = (HttpRequest *)operator_new(0x30);
    req.super___shared_ptr<hwnet::http::HttpRequest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    HttpRequest::HttpRequest
              (this,(shared_ptr<hwnet::http::HttpSession> *)
                    &req.super___shared_ptr<hwnet::http::HttpRequest,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount,(shared_ptr<hwnet::http::HttpPacket> *)packet);
    std::__shared_ptr<hwnet::http::HttpRequest,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<hwnet::http::HttpRequest,void>(local_48,this);
    pHVar5 = (HttpResponse *)operator_new(0x30);
    std::__shared_ptr<hwnet::http::HttpSession,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<hwnet::http::HttpSession,void>
              ((__shared_ptr<hwnet::http::HttpSession,(__gnu_cxx::_Lock_policy)2> *)&local_68,__r);
    local_58.super___shared_ptr<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)operator_new(0xe0);
    (local_58.super___shared_ptr<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    http_major = 1;
    (local_58.super___shared_ptr<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    http_minor = 1;
    ((local_58.super___shared_ptr<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->url)
    ._M_dataplus._M_p =
         (pointer)&((local_58.
                     super___shared_ptr<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->url).field_2;
    ((local_58.super___shared_ptr<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->url)
    ._M_string_length = 0;
    ((local_58.super___shared_ptr<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->url)
    .field_2._M_local_buf[0] = '\0';
    ((local_58.super___shared_ptr<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    status)._M_dataplus._M_p =
         (pointer)&((local_58.
                     super___shared_ptr<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->status).field_2;
    ((local_58.super___shared_ptr<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    status)._M_string_length = 0;
    ((local_58.super___shared_ptr<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    status).field_2._M_local_buf[0] = '\0';
    p_Var1 = &((local_58.super___shared_ptr<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->headers)._M_t._M_impl.super__Rb_tree_header;
    ((local_58.super___shared_ptr<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    ((local_58.super___shared_ptr<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    ((local_58.super___shared_ptr<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    ((local_58.super___shared_ptr<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    ((local_58.super___shared_ptr<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    headers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    ((local_58.super___shared_ptr<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    field)._M_dataplus._M_p =
         (pointer)&((local_58.
                     super___shared_ptr<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->field).field_2;
    ((local_58.super___shared_ptr<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    field)._M_string_length = 0;
    ((local_58.super___shared_ptr<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    field).field_2._M_local_buf[0] = '\0';
    ((local_58.super___shared_ptr<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    value)._M_dataplus._M_p =
         (pointer)&((local_58.
                     super___shared_ptr<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                   ->value).field_2;
    ((local_58.super___shared_ptr<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    value)._M_string_length = 0;
    ((local_58.super___shared_ptr<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    value).field_2._M_local_buf[0] = '\0';
    ((local_58.super___shared_ptr<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    onBody).super__Function_base._M_manager = (_Manager_type)0x0;
    ((local_58.super___shared_ptr<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    onBody)._M_invoker = (_Invoker_type)0x0;
    *(undefined8 *)
     &((local_58.super___shared_ptr<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      onBody).super__Function_base._M_functor = 0;
    *(undefined8 *)
     ((long)&((local_58.super___shared_ptr<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->onBody).super__Function_base._M_functor + 8) = 0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<hwnet::http::HttpPacket*>
              (&local_58.super___shared_ptr<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               local_58.super___shared_ptr<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    HttpResponse::HttpResponse(pHVar5,&local_68,&local_58);
    std::__shared_ptr<hwnet::http::HttpResponse,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<hwnet::http::HttpResponse,void>
              ((__shared_ptr<hwnet::http::HttpResponse,(__gnu_cxx::_Lock_policy)2> *)
               &req.super___shared_ptr<hwnet::http::HttpRequest,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,pHVar5);
    if (local_58.super___shared_ptr<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.super___shared_ptr<hwnet::http::HttpPacket,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_68.super___shared_ptr<hwnet::http::HttpSession,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.super___shared_ptr<hwnet::http::HttpSession,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (__r[0xb]._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::__throw_bad_function_call();
    }
    (*(code *)__r[0xc]._M_ptr)
              (&__r[10]._M_refcount,local_48,
               &req.super___shared_ptr<hwnet::http::HttpRequest,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  else {
    pHVar5 = (HttpResponse *)operator_new(0x30);
    std::__shared_ptr<hwnet::http::HttpSession,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<hwnet::http::HttpSession,void>
              ((__shared_ptr<hwnet::http::HttpSession,(__gnu_cxx::_Lock_policy)2> *)
               &req.super___shared_ptr<hwnet::http::HttpRequest,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,__r);
    HttpResponse::HttpResponse
              (pHVar5,(shared_ptr<hwnet::http::HttpSession> *)
                      &req.super___shared_ptr<hwnet::http::HttpRequest,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount,(shared_ptr<hwnet::http::HttpPacket> *)packet);
    std::__shared_ptr<hwnet::http::HttpResponse,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<hwnet::http::HttpResponse,void>
              ((__shared_ptr<hwnet::http::HttpResponse,(__gnu_cxx::_Lock_policy)2> *)local_48,pHVar5
              );
    if (resp.super___shared_ptr<hwnet::http::HttpResponse,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 resp.super___shared_ptr<hwnet::http::HttpResponse,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
    }
    if (__r[0xd]._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::__throw_bad_function_call();
    }
    (*(code *)__r[0xe]._M_ptr)(&__r[0xc]._M_refcount,local_48);
  }
  if (req.super___shared_ptr<hwnet::http::HttpRequest,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               req.super___shared_ptr<hwnet::http::HttpRequest,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return 0;
}

Assistant:

int HttpSession::on_headers_complete(http_parser *parser) {
	auto session = (HttpSession*)parser->data;
	if(!session->packet->field.empty()) {
		session->packet->headers[session->packet->field] = session->packet->value;
		session->packet->field.clear();
		session->packet->value.clear();
	}

	session->packet->http_major = parser->http_major;
	session->packet->http_minor = parser->http_minor;

	if(session->side == ServerSide) {
		auto req = HttpRequest::Ptr(new HttpRequest(nullptr,session->packet));
		auto resp = HttpResponse::Ptr(new HttpResponse(session->my_shared_from_this(),std::shared_ptr<HttpPacket>(new HttpPacket)));
		session->onRequest(req,resp);
	} else {
		auto resp = HttpResponse::Ptr(new HttpResponse(session->my_shared_from_this(),session->packet));
		session->onResponse(resp);		
	}
	
	return 0;
}